

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void version(void)

{
  printf("%s %d.%d.%d\n","gbcc",0,1,0);
  exit(0);
}

Assistant:

void version()
{
#ifdef NDEBUG
    printf("%s %d.%d.%d\n", pgm, VERSION_MAJOR, VERSION_MINOR, PATCH);
#else
    printf("%s %d.%d.%d debug\n", pgm, VERSION_MAJOR, VERSION_MINOR, PATCH);
#endif
    exit(EXIT_SUCCESS);
}